

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

void ear::checkScreenSpeakers(Layout *layout)

{
  bool bVar1;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *this;
  string *psVar2;
  invalid_argument *this_00;
  not_implemented *this_01;
  PolarPosition *__return_storage_ptr__;
  double extraout_XMM0_Qa;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_85;
  allocator<char> local_71;
  string local_70;
  PolarPosition local_50;
  double abs_az;
  Channel *channel;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *__range1;
  Layout *layout_local;
  
  this = Layout::channels(layout);
  __end1 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(this);
  channel = (Channel *)std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                                *)&channel);
    if (!bVar1) {
      return;
    }
    abs_az = (double)__gnu_cxx::
                     __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                     ::operator*(&__end1);
    psVar2 = Channel::name_abi_cxx11_((Channel *)abs_az);
    bVar1 = std::operator==(psVar2,"M+SC");
    if (bVar1) {
LAB_001ddd66:
      __return_storage_ptr__ = &local_50;
      Channel::polarPosition(__return_storage_ptr__,(Channel *)abs_az);
      std::abs((int)__return_storage_ptr__);
      if (((extraout_XMM0_Qa < 5.0) || (25.0 <= extraout_XMM0_Qa)) &&
         ((extraout_XMM0_Qa < 35.0 || (60.0 <= extraout_XMM0_Qa)))) {
        local_85 = 1;
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,
                   "M+SC or M-SC has azimuth not in the allowed ranges of 5 to 25 and 35 to 60 degrees"
                   ,&local_71);
        invalid_argument::invalid_argument(this_00,&local_70);
        local_85 = 0;
        __cxa_throw(this_00,&invalid_argument::typeinfo,invalid_argument::~invalid_argument);
      }
      if (25.0 < extraout_XMM0_Qa) {
        this_01 = (not_implemented *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,
                   "M+SC and M-SC with azimuths wider than 25 degrees are not currently supported",
                   &local_a9);
        not_implemented::not_implemented(this_01,&local_a8);
        __cxa_throw(this_01,&not_implemented::typeinfo,not_implemented::~not_implemented);
      }
    }
    else {
      psVar2 = Channel::name_abi_cxx11_((Channel *)abs_az);
      bVar1 = std::operator==(psVar2,"M-SC");
      if (bVar1) goto LAB_001ddd66;
    }
    __gnu_cxx::
    __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void checkScreenSpeakers(const Layout& layout) {
    for (auto& channel : layout.channels()) {
      if (channel.name() == "M+SC" || channel.name() == "M-SC") {
        double abs_az = std::abs(channel.polarPosition().azimuth);
        if (!((5.0 <= abs_az && abs_az < 25.0) ||
              (35.0 <= abs_az && abs_az < 60.0))) {
          throw invalid_argument(
              "M+SC or M-SC has azimuth not in the allowed ranges of 5 to 25 "
              "and 35 to 60 degrees");
        }

        if (25.0 < abs_az) {
          throw not_implemented(
              "M+SC and M-SC with azimuths wider than 25 degrees are not "
              "currently supported");
        }
      }
    }
  }